

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::parse_value<int>(string *text,int *value)

{
  byte bVar1;
  long *plVar2;
  long lVar3;
  argument_incorrect_type *paVar4;
  istringstream local_198 [8];
  istringstream is;
  int *value_local;
  string *text_local;
  
  std::__cxx11::istringstream::istringstream(local_198,(string *)text,_S_in);
  plVar2 = (long *)std::istream::operator>>(local_198,value);
  bVar1 = std::ios::operator!((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if ((bVar1 & 1) != 0) {
    paVar4 = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(paVar4,text);
    __cxa_throw(paVar4,&argument_incorrect_type::typeinfo,
                argument_incorrect_type::~argument_incorrect_type);
  }
  std::__cxx11::istringstream::rdbuf();
  lVar3 = std::streambuf::in_avail();
  if (lVar3 != 0) {
    paVar4 = (argument_incorrect_type *)__cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type(paVar4,text);
    __cxa_throw(paVar4,&argument_incorrect_type::typeinfo,
                argument_incorrect_type::~argument_incorrect_type);
  }
  std::__cxx11::istringstream::~istringstream(local_198);
  return;
}

Assistant:

void
    parse_value(const std::string& text, T& value)
    {
      std::istringstream is(text);
      if (!(is >> value))
      {
        throw argument_incorrect_type(text);
      }

      if (is.rdbuf()->in_avail() != 0)
      {
        throw argument_incorrect_type(text);
      }
    }